

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_set.hpp
# Opt level: O1

bool Omega_h::intersects<int>
               (set<int,_std::less<int>,_std::allocator<int>_> *a,
               set<int,_std::less<int>,_std::allocator<int>_> *b)

{
  _Base_ptr p_Var1;
  _Rb_tree_node_base *p_Var2;
  _Base_ptr p_Var3;
  _Rb_tree_header *p_Var4;
  _Base_ptr p_Var5;
  _Rb_tree_header *p_Var6;
  bool bVar7;
  
  p_Var2 = (b->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var4 = &(b->_M_t)._M_impl.super__Rb_tree_header;
  bVar7 = (_Rb_tree_header *)p_Var2 != p_Var4;
  if (bVar7) {
    p_Var1 = (a->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent;
    p_Var6 = &(a->_M_t)._M_impl.super__Rb_tree_header;
    do {
      p_Var3 = &p_Var6->_M_header;
      if (p_Var1 != (_Base_ptr)0x0) {
        p_Var5 = p_Var1;
        do {
          if ((int)p_Var2[1]._M_color <= (int)p_Var5[1]._M_color) {
            p_Var3 = p_Var5;
          }
          p_Var5 = (&p_Var5->_M_left)[(int)p_Var5[1]._M_color < (int)p_Var2[1]._M_color];
        } while (p_Var5 != (_Base_ptr)0x0);
      }
      p_Var5 = &p_Var6->_M_header;
      if (((_Rb_tree_header *)p_Var3 != p_Var6) &&
         (p_Var5 = p_Var3, (int)p_Var2[1]._M_color < (int)p_Var3[1]._M_color)) {
        p_Var5 = &p_Var6->_M_header;
      }
      if ((_Rb_tree_header *)p_Var5 != p_Var6) {
        return bVar7;
      }
      p_Var2 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var2);
      bVar7 = (_Rb_tree_header *)p_Var2 != p_Var4;
    } while (bVar7);
  }
  return bVar7;
}

Assistant:

bool intersects(std::set<T>& a, std::set<T> const& b) {
  for (auto& x : b) {
    auto it = a.find(x);
    if (it != a.end()) return true;
  }
  return false;
}